

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

void elf_writesections(GlobalVars *gv,FILE *f)

{
  node *pnVar1;
  
  for (pnVar1 = (gv->lnksec).first; pnVar1->next != (node *)0x0; pnVar1 = pnVar1->next) {
    if (((ulong)pnVar1[2].next & 0x300) == 0x100) {
      fwritex(f,pnVar1[8].next,(size_t)pnVar1[5].next);
    }
  }
  for (pnVar1 = (gv->lnksec).first; pnVar1->next != (node *)0x0; pnVar1 = pnVar1->next) {
    if (((ulong)pnVar1[2].next & 0x300) == 0) {
      fwritex(f,pnVar1[8].next,(size_t)pnVar1[5].next);
    }
  }
  return;
}

Assistant:

void elf_writesections(struct GlobalVars *gv,FILE *f)
/* write all linked sections */
{
  struct LinkedSection *ls;

  /* write all allocated sections */
  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    if (ls->flags & SF_ALLOC) {
      if (!(ls->flags & SF_UNINITIALIZED))
        fwritex(f,ls->data,ls->size);
    }
  }
  /* unallocated sections at last */
  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    if (!(ls->flags & SF_ALLOC)) {
      if (!(ls->flags & SF_UNINITIALIZED))
        fwritex(f,ls->data,ls->size);
    }
  }
}